

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkPrintSharing(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  void *pvVar1;
  Vec_Ptr_t *p_00;
  uint i;
  int iVar2;
  uint uVar3;
  uint i_00;
  ulong uVar4;
  Abc_Obj_t *pObj2;
  Abc_Obj_t *pObj1;
  
  puts("Statistics about sharing of logic nodes among the CO pairs.");
  printf("(CO1,CO2)=NumShared : ");
  for (i = 0; (int)i < pNtk->vCos->nSize; i = i + 1) {
    pObj1 = Abc_NtkCo(pNtk,i);
    p = Abc_NtkDfsNodes(pNtk,&pObj1,1);
    for (iVar2 = 0; iVar2 < p->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(p,iVar2);
      *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) | 0x10;
    }
    uVar4 = 0;
    while (i_00 = (uint)uVar4, (int)i_00 < pNtk->vCos->nSize) {
      pObj2 = Abc_NtkCo(pNtk,i_00);
      if (i < i_00) {
        p_00 = Abc_NtkDfsNodes(pNtk,&pObj2,1);
        uVar3 = 0;
        for (iVar2 = 0; iVar2 < p_00->nSize; iVar2 = iVar2 + 1) {
          pvVar1 = Vec_PtrEntry(p_00,iVar2);
          uVar3 = uVar3 + ((*(uint *)((long)pvVar1 + 0x14) >> 4 & 1) != 0);
        }
        printf("(%d,%d)=%d ",(ulong)i,uVar4,(ulong)uVar3);
        Vec_PtrFree(p_00);
      }
      uVar4 = (ulong)(i_00 + 1);
    }
    for (iVar2 = 0; iVar2 < p->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(p,iVar2);
      *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) & 0xef;
    }
    Vec_PtrFree(p);
  }
  putchar(10);
  return;
}

Assistant:

void Abc_NtkPrintSharing( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes1, * vNodes2;
    Abc_Obj_t * pObj1, * pObj2, * pNode1, * pNode2;
    int i, k, m, n, Counter;

    // print the template
    printf( "Statistics about sharing of logic nodes among the CO pairs.\n" );
    printf( "(CO1,CO2)=NumShared : " );
    // go though the CO pairs
    Abc_NtkForEachCo( pNtk, pObj1, i )
    {
        vNodes1 = Abc_NtkDfsNodes( pNtk, &pObj1, 1 );
        // mark the nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode1, m )
            pNode1->fMarkA = 1;
        // go through the second COs
        Abc_NtkForEachCo( pNtk, pObj2, k )
        {
            if ( i >= k )
                continue;
            vNodes2 = Abc_NtkDfsNodes( pNtk, &pObj2, 1 );
            // count the number of marked
            Counter = 0;
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes2, pNode2, n )
                Counter += pNode2->fMarkA;
            // print
            printf( "(%d,%d)=%d ", i, k, Counter );
            Vec_PtrFree( vNodes2 );
        }
        // unmark the nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode1, m )
            pNode1->fMarkA = 0;
        Vec_PtrFree( vNodes1 );
    }
    printf( "\n" );
}